

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlUnmarshall.c
# Opt level: O2

JL_STATUS UnmarshallDictionary
                    (JlDataObject *DictionaryObject,JlMarshallElement *StructDescription,
                    size_t StructDescriptionCount,_Bool IgnoreExistingValuesInStruct,void *Structure
                    ,size_t *pErrorAtPos)

{
  size_t sVar1;
  JlDataObject *StringObject;
  size_t *psVar2;
  JL_STATUS JVar3;
  JL_DATA_TYPE JVar4;
  uint32_t uVar5;
  size_t sVar6;
  size_t ListCount;
  undefined7 in_register_00000009;
  JlMarshallElement *Description;
  JlDataObject *Memory;
  uint uVar7;
  ulong uVar8;
  undefined8 *Output;
  uint32_t i;
  undefined8 *puVar9;
  void *pvVar10;
  ulong uVar11;
  undefined8 *local_a8;
  JlDataObject *local_a0;
  JlDataObject *object;
  uint local_8c;
  size_t *local_88;
  void *local_80;
  JlDataObject *local_78;
  JlListItem *enumerator;
  size_t local_68;
  uint local_5c;
  size_t local_58;
  size_t local_50;
  void *local_48;
  JlDataObject *local_40;
  ulong local_38;
  
  local_8c = (uint)CONCAT71(in_register_00000009,IgnoreExistingValuesInStruct);
  uVar7 = 0;
  JVar3 = JL_STATUS_SUCCESS;
  local_88 = pErrorAtPos;
  local_80 = Structure;
  local_40 = DictionaryObject;
  local_38 = StructDescriptionCount;
  do {
    uVar8 = (ulong)uVar7;
    if ((local_38 <= uVar8) || (JVar3 != JL_STATUS_SUCCESS)) {
      return JVar3;
    }
    object = (JlDataObject *)0x0;
    JVar3 = JlGetObjectFromDictionaryByKey(local_40,StructDescription[uVar8].Name,&object);
    if (JVar3 == JL_STATUS_SUCCESS) {
      Description = StructDescription + uVar8;
      Output = (undefined8 *)(Description->FieldOffset + (long)Structure);
      JVar4 = JlGetObjectType(object);
      StringObject = object;
      if ((JVar4 == JL_DATA_TYPE_LIST & Description->IsArray) == 1) {
        local_5c = local_8c & 0xff;
        uVar5 = JlGetListCount(object);
        JVar3 = JlMemoryVerifyCountFieldLargeEnoughForValue
                          (Description->CountFieldSize,(ulong)uVar5);
        if (JVar3 == JL_STATUS_SUCCESS) {
          pvVar10 = (void *)(Description->CountFieldOffset + (long)Structure);
          sVar6 = Description->CountFieldSize;
          local_78 = object;
          uVar5 = JlGetListCount(object);
          ListCount = JlMemoryReadCountValue(pvVar10,sVar6);
          local_50 = sVar6;
          local_48 = pvVar10;
          JlMemoryWriteCountValue(pvVar10,sVar6,0);
          if (((char)local_8c == '\0') && (ListCount != 0)) {
            FreeUnmarshalledList(Description,Output,ListCount);
          }
          pErrorAtPos = local_88;
          sVar1 = Description->ArrayFieldSize;
          if (uVar5 == 0) {
            if (sVar1 == 0) {
              *Output = 0;
            }
            else {
              memset(Output,0,sVar1);
            }
            JVar3 = JL_STATUS_SUCCESS;
            Structure = local_80;
            goto LAB_00104311;
          }
          uVar8 = (ulong)uVar5;
          if (sVar1 == 0) {
            local_a8 = (undefined8 *)WjTestLib_Calloc(Description->ArrayItemSize * uVar8,1);
            JVar3 = JL_STATUS_OUT_OF_MEMORY;
            if (local_a8 != (undefined8 *)0x0) {
              *Output = local_a8;
              goto LAB_001045cb;
            }
          }
          else {
            memset(Output,0,sVar1);
            JVar3 = JL_STATUS_TOO_MANY_ITEMS;
            local_a8 = Output;
            if (uVar8 <= Description->ArrayFieldSize / Description->ArrayItemSize) {
LAB_001045cb:
              enumerator = (JlListItem *)0x0;
              uVar11 = 0;
              local_58 = 0;
              JVar3 = JL_STATUS_SUCCESS;
              while ((pErrorAtPos = local_88, uVar11 < uVar8 && (JVar3 == JL_STATUS_SUCCESS))) {
                sVar6 = Description->ArrayItemSize;
                local_a0 = (JlDataObject *)0x0;
                JVar3 = JlGetObjectListNextItem(local_78,&local_a0,&enumerator);
                if (JVar3 == JL_STATUS_SUCCESS) {
                  JVar4 = JlGetObjectType(local_a0);
                  psVar2 = local_88;
                  if (Description->Type == JVar4) {
                    JVar3 = UnmarshalObject(local_a0,Description,SUB41(local_5c,0),
                                            (undefined8 *)(sVar6 * uVar11 + (long)local_a8),local_88
                                           );
                    if (JVar3 == JL_STATUS_SUCCESS) {
                      local_58 = local_58 + 1;
                      JlMemoryWriteCountValue(local_48,local_50,local_58);
                      JVar3 = JL_STATUS_SUCCESS;
                    }
                  }
                  else {
                    if (local_88 != (size_t *)0x0) {
                      sVar6 = JlGetObjectTag(local_a0);
                      *psVar2 = sVar6;
                    }
                    JVar3 = JL_STATUS_WRONG_TYPE;
                  }
                }
                uVar11 = uVar11 + 1;
              }
            }
          }
          Structure = local_80;
          if (((pErrorAtPos != (size_t *)0x0) && (JVar3 != JL_STATUS_SUCCESS)) &&
             (*pErrorAtPos == 0)) {
            sVar6 = JlGetObjectTag(local_78);
            *pErrorAtPos = sVar6;
          }
        }
        if (((pErrorAtPos != (size_t *)0x0) && (JVar3 != JL_STATUS_SUCCESS)) && (*pErrorAtPos == 0))
        {
          sVar6 = JlGetObjectTag(object);
          *pErrorAtPos = sVar6;
        }
      }
      else if (Description->Type == JVar4) {
        if (Description->IsBase64 == true) {
          local_78 = (JlDataObject *)Description->CountFieldSize;
          enumerator = (JlListItem *)0x0;
          pvVar10 = (void *)(Description->CountFieldOffset + (long)Structure);
          puVar9 = Output;
          if (Description->FieldSize != 0) {
            puVar9 = (undefined8 *)0x0;
          }
          if ((((_Bool)(char)local_8c == false) && (Description->FieldSize == 0)) &&
             ((void *)*Output != (void *)0x0)) {
            WjTestLib_Free((void *)*Output);
            *Output = 0;
          }
          JVar3 = JlGetObjectString(StringObject,(char **)&enumerator);
          if (JVar3 == JL_STATUS_SUCCESS) {
            local_a0 = (JlDataObject *)0x0;
            local_68 = 0;
            if (enumerator == (JlListItem *)0x0) {
              JVar3 = JL_STATUS_INVALID_DATA;
              if (Description->FieldSize == 0) {
                *puVar9 = 0;
                JVar3 = JlMemoryWriteCountValue(pvVar10,(size_t)local_78,0);
              }
            }
            else {
              JVar3 = JlBase64Decode((char *)enumerator,&local_a0,&local_68);
              Memory = local_a0;
              if (JVar3 == JL_STATUS_SUCCESS) {
                sVar1 = Description->FieldSize;
                if (sVar1 == 0) {
                  *puVar9 = local_a0;
                  JVar3 = JlMemoryWriteCountValue(pvVar10,(size_t)local_78,local_68);
                  if (JVar3 == JL_STATUS_SUCCESS) {
                    JVar3 = JL_STATUS_SUCCESS;
                    goto LAB_00104405;
                  }
                  *puVar9 = 0;
                  Memory = local_a0;
                }
                else {
                  JVar3 = JL_STATUS_INVALID_DATA;
                  if (local_68 == sVar1) {
                    memcpy(Output,local_a0,sVar1);
                    JVar3 = JL_STATUS_SUCCESS;
                  }
                }
                WjTestLib_Free(Memory);
              }
            }
          }
LAB_00104405:
          pErrorAtPos = local_88;
          Structure = local_80;
          if ((local_88 != (size_t *)0x0) && (JVar3 != JL_STATUS_SUCCESS)) {
            sVar6 = JlGetObjectTag(StringObject);
            *pErrorAtPos = sVar6;
            Structure = local_80;
          }
        }
        else {
          JVar3 = UnmarshalObject(object,Description,(_Bool)(char)local_8c,Output,pErrorAtPos);
        }
      }
      else {
        JVar3 = JL_STATUS_WRONG_TYPE;
        if (pErrorAtPos != (size_t *)0x0) {
          sVar6 = JlGetObjectTag(object);
          *pErrorAtPos = sVar6;
          JVar3 = JL_STATUS_WRONG_TYPE;
        }
      }
    }
    else if (JVar3 == JL_STATUS_NOT_FOUND) {
      JVar3 = JL_STATUS_SUCCESS;
    }
LAB_00104311:
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

static
JL_STATUS
    UnmarshallDictionary
    (
        JlDataObject const*         DictionaryObject,
        JlMarshallElement const*    StructDescription,
        size_t                      StructDescriptionCount,
        bool                        IgnoreExistingValuesInStruct,
        void*                       Structure,
        size_t*                     pErrorAtPos
    )
{
    JL_STATUS jlStatus = JL_STATUS_SUCCESS;

    for( uint32_t i=0; i<StructDescriptionCount && JL_STATUS_SUCCESS==jlStatus; i++ )
    {
        JlMarshallElement const* currentItem = &StructDescription[i];

        // Get object
        JlDataObject* object = NULL;
        JL_DATA_TYPE objectType = JL_DATA_TYPE_NONE;

        jlStatus = JlGetObjectFromDictionaryByKey( DictionaryObject, currentItem->Name, &object );
        if( JL_STATUS_SUCCESS == jlStatus )
        {
            void* elementInStruct = (void*)(((uint8_t*)Structure)+currentItem->FieldOffset);
            objectType = JlGetObjectType( object );

            if( currentItem->IsArray && JL_DATA_TYPE_LIST == objectType )
            {
                // First verify that the count field is large enough
                size_t arrayCount = JlGetListCount( object );
                jlStatus = JlMemoryVerifyCountFieldLargeEnoughForValue( currentItem->CountFieldSize, arrayCount );
                if( JL_STATUS_SUCCESS == jlStatus )
                {
                    // Unmarshall the list
                    void* arrayCountPtr = ((uint8_t*)Structure) + currentItem->CountFieldOffset;
                    jlStatus = UnmarshalList(
                        object,
                        currentItem,
                        IgnoreExistingValuesInStruct,
                        elementInStruct,
                        arrayCountPtr,
                        currentItem->CountFieldSize,
                        pErrorAtPos );
                }

                if( JL_STATUS_SUCCESS != jlStatus )
                {
                    if( NULL != pErrorAtPos && 0 == *pErrorAtPos )
                    {
                        *pErrorAtPos = JlGetObjectTag( object );
                    }
                }
            }
            else if( currentItem->Type == objectType )
            {
                if( currentItem->IsBase64 )
                {
                    void* dataSizeElementInStruct = (void*)(((uint8_t*)Structure)+currentItem->CountFieldOffset);
                    jlStatus = UnmarshalBinary( object, dataSizeElementInStruct, currentItem->CountFieldSize, currentItem, IgnoreExistingValuesInStruct, elementInStruct, pErrorAtPos );
                }
                else
                {
                    jlStatus = UnmarshalObject( object, currentItem, IgnoreExistingValuesInStruct, elementInStruct, pErrorAtPos );
                }
            }
            else
            {
                // Wrong type
                jlStatus = JL_STATUS_WRONG_TYPE;
                if( NULL != pErrorAtPos )
                {
                    *pErrorAtPos = JlGetObjectTag( object );
                }
            }

        }
        else if( JL_STATUS_NOT_FOUND == jlStatus )
        {
            // Keyname not found in dictionary. Do not consider this an error, we just don't have any value for this item, so we leave
            // it as default
            jlStatus = JL_STATUS_SUCCESS;
        }
    }

    return jlStatus;
}